

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O1

ByteString * OSSL::grp2ByteString(ByteString *__return_storage_ptr__,EC_GROUP *grp)

{
  int iVar1;
  uchar *p;
  uchar *local_18;
  
  ByteString::ByteString(__return_storage_ptr__);
  if (grp != (EC_GROUP *)0x0) {
    iVar1 = i2d_ECPKParameters((EC_GROUP *)grp,(uchar **)0x0);
    ByteString::resize(__return_storage_ptr__,(long)iVar1);
    local_18 = ByteString::operator[](__return_storage_ptr__,0);
    i2d_ECPKParameters((EC_GROUP *)grp,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteString OSSL::grp2ByteString(const EC_GROUP* grp)
{
	ByteString rv;

	if (grp != NULL)
	{
		rv.resize(i2d_ECPKParameters(grp, NULL));
		unsigned char *p = &rv[0];
		i2d_ECPKParameters(grp, &p);
	}

	return rv;
}